

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::StringFromGTestEnv_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *flag,char *default_value)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  string env_var;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  FlagToEnvVar_abi_cxx11_(&local_40,this,flag);
  pcVar3 = getenv(local_40._M_dataplus._M_p);
  if (pcVar3 == (char *)0x0) {
    iVar2 = strcmp((char *)this,"output");
    if (iVar2 == 0) {
      pcVar3 = getenv("XML_OUTPUT_FILE");
      if (pcVar3 != (char *)0x0) {
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"xml:","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_60);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar6) {
          lVar1 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_60[0] != local_50) {
          operator_delete(local_60[0]);
        }
        goto LAB_0011d540;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,flag,(allocator *)local_60);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar4);
  }
LAB_0011d540:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* value = posix::GetEnv(env_var.c_str());
  if (value != NULL) {
    return value;
  }

  // As a special case for the 'output' flag, if GTEST_OUTPUT is not
  // set, we look for XML_OUTPUT_FILE, which is set by the Bazel build
  // system.  The value of XML_OUTPUT_FILE is a filename without the
  // "xml:" prefix of GTEST_OUTPUT.
  //
  // The net priority order after flag processing is thus:
  //   --gtest_output command line flag
  //   GTEST_OUTPUT environment variable
  //   XML_OUTPUT_FILE environment variable
  //   'default_value'
  if (strcmp(flag, "output") == 0) {
    value = posix::GetEnv("XML_OUTPUT_FILE");
    if (value != NULL) {
      return std::string("xml:") + value;
    }
  }
  return default_value;
}